

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store_halfword.c
# Opt level: O0

void load_store_halfword(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  ushort *in_RSI;
  long in_RDI;
  uint16_t value_2;
  uint32_t value_1;
  uint32_t addr;
  load_store_halfword_t *instr;
  uint32_t value_3;
  uint32_t value;
  uint32_t in_stack_ffffffffffffff1c;
  arm7tdmi_t *in_stack_ffffffffffffff20;
  undefined2 local_88;
  int local_78;
  int local_4c;
  undefined2 local_3c;
  int local_2c;
  undefined2 local_20;
  
  uVar2 = (uint)(*in_RSI >> 3 & 7);
  if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_78 = *(int *)(in_RDI + 0x6c + (ulong)(uVar2 - 8) * 4);
  }
  else if (uVar2 < 0xd) {
    local_78 = *(int *)(in_RDI + 0x38 + (ulong)uVar2 * 4);
  }
  else if (uVar2 == 0xd) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_4c = *(int *)(in_RDI + 0x84);
      break;
    case 0x12:
      local_4c = *(int *)(in_RDI + 0x90);
      break;
    case 0x13:
      local_4c = *(int *)(in_RDI + 0x88);
      break;
    default:
      local_4c = *(int *)(in_RDI + 0x80);
      break;
    case 0x17:
      local_4c = *(int *)(in_RDI + 0x8c);
      break;
    case 0x1b:
      local_4c = *(int *)(in_RDI + 0x94);
    }
    local_78 = local_4c;
  }
  else if (uVar2 == 0xe) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_2c = *(int *)(in_RDI + 0x9c);
      break;
    case 0x12:
      local_2c = *(int *)(in_RDI + 0xa8);
      break;
    case 0x13:
      local_2c = *(int *)(in_RDI + 0xa0);
      break;
    default:
      local_2c = *(int *)(in_RDI + 0x98);
      break;
    case 0x17:
      local_2c = *(int *)(in_RDI + 0xa4);
      break;
    case 0x1b:
      local_2c = *(int *)(in_RDI + 0xac);
    }
    local_78 = local_2c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_78 = *(int *)(in_RDI + 0xb0);
  }
  uVar2 = local_78 + (uint)(*in_RSI >> 6 & 0x1f) * 2;
  if ((*in_RSI >> 0xb & 1) == 0) {
    uVar4 = (uint)(*in_RSI & 7);
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_88 = (undefined2)*(undefined4 *)(in_RDI + 0x6c + (ulong)(uVar4 - 8) * 4);
    }
    else if (uVar4 < 0xd) {
      local_88 = (undefined2)*(undefined4 *)(in_RDI + 0x38 + (ulong)uVar4 * 4);
    }
    else if (uVar4 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x84);
        break;
      case 0x12:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x90);
        break;
      case 0x13:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x88);
        break;
      default:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x80);
        break;
      case 0x17:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x8c);
        break;
      case 0x1b:
        local_3c = (undefined2)*(undefined4 *)(in_RDI + 0x94);
      }
      local_88 = local_3c;
    }
    else if (uVar4 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0x9c);
        break;
      case 0x12:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0xa8);
        break;
      case 0x13:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0xa0);
        break;
      default:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0x98);
        break;
      case 0x17:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0xa4);
        break;
      case 0x1b:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0xac);
      }
      local_88 = local_20;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_88 = (undefined2)*(undefined4 *)(in_RDI + 0xb0);
    }
    (**(code **)(in_RDI + 0x20))(uVar2,local_88,2);
  }
  else {
    uVar1 = (**(code **)(in_RDI + 8))(uVar2,2);
    uVar3 = arm_ror((status_register_t *)0x0,(uint)uVar1,(uVar2 & 1) << 3);
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar3);
    }
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      *(uint32_t *)(in_RDI + 0x6c + (ulong)(uVar2 - 8) * 4) = uVar3;
    }
    else if (uVar2 < 0xd) {
      *(uint32_t *)(in_RDI + 0x38 + (ulong)uVar2 * 4) = uVar3;
    }
    else if (uVar2 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint32_t *)(in_RDI + 0x84) = uVar3;
        break;
      case 0x12:
        *(uint32_t *)(in_RDI + 0x90) = uVar3;
        break;
      case 0x13:
        *(uint32_t *)(in_RDI + 0x88) = uVar3;
        break;
      default:
        *(uint32_t *)(in_RDI + 0x80) = uVar3;
        break;
      case 0x17:
        *(uint32_t *)(in_RDI + 0x8c) = uVar3;
        break;
      case 0x1b:
        *(uint32_t *)(in_RDI + 0x94) = uVar3;
      }
    }
    else if (uVar2 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint32_t *)(in_RDI + 0x9c) = uVar3;
        break;
      case 0x12:
        *(uint32_t *)(in_RDI + 0xa8) = uVar3;
        break;
      case 0x13:
        *(uint32_t *)(in_RDI + 0xa0) = uVar3;
        break;
      default:
        *(uint32_t *)(in_RDI + 0x98) = uVar3;
        break;
      case 0x17:
        *(uint32_t *)(in_RDI + 0xa4) = uVar3;
        break;
      case 0x1b:
        *(uint32_t *)(in_RDI + 0xac) = uVar3;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
      else {
        set_pc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
    }
    (**(code **)(in_RDI + 0x30))(1);
  }
  return;
}

Assistant:

void load_store_halfword(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_store_halfword_t* instr = &thminstr->LOAD_STORE_HALFWORD;
    word addr = get_register(state, instr->rb) + (instr->offset << 1);
    if (instr->l) {
        word value = state->read_half(addr, ACCESS_NONSEQUENTIAL);
        value = arm_ror(NULL, value, (addr & 0x1) << 3);
        set_register(state, instr->rd, value);
        state->cpu_idle(1);
    } else {
        half value = get_register(state, instr->rd) & 0xFFFF;
        state->write_half(addr, value, ACCESS_NONSEQUENTIAL);
    }
}